

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O3

void __thiscall tcu::CaseTreeNode::~CaseTreeNode(CaseTreeNode *this)

{
  CaseTreeNode *this_00;
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer ppCVar3;
  
  ppCVar3 = (this->m_children).
            super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppCVar3 !=
      (this->m_children).
      super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      this_00 = *ppCVar3;
      if (this_00 != (CaseTreeNode *)0x0) {
        ~CaseTreeNode(this_00);
      }
      operator_delete(this_00,0x38);
      ppCVar3 = ppCVar3 + 1;
    } while (ppCVar3 !=
             (this->m_children).
             super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
    ppCVar3 = (this->m_children).
              super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  if (ppCVar3 != (pointer)0x0) {
    operator_delete(ppCVar3,(long)(this->m_children).
                                  super__Vector_base<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppCVar3
                   );
  }
  pcVar1 = (this->m_name)._M_dataplus._M_p;
  paVar2 = &(this->m_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

CaseTreeNode::~CaseTreeNode (void)
{
	for (vector<CaseTreeNode*>::const_iterator i = m_children.begin(); i != m_children.end(); ++i)
		delete *i;
}